

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int matchQuality(FuncDef *p,int nArg,u8 enc)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = 4;
  if (p->nArg != nArg) {
    if (nArg == -2) {
      iVar2 = 6;
      if (p->xSFunc == (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0) {
        iVar2 = 0;
      }
      return iVar2;
    }
    if (-1 < p->nArg) {
      return 0;
    }
    uVar1 = 1;
  }
  if ((p->funcFlags & 3) == (uint)enc) {
    return uVar1 | 2;
  }
  return uVar1 + (((p->funcFlags & (uint)enc) >> 1 & 1) != 0);
}

Assistant:

static int matchQuality(
  FuncDef *p,     /* The function we are evaluating for match quality */
  int nArg,       /* Desired number of arguments.  (-1)==any */
  u8 enc          /* Desired text encoding */
){
  int match;
  assert( p->nArg>=-1 );

  /* Wrong number of arguments means "no match" */
  if( p->nArg!=nArg ){
    if( nArg==(-2) ) return (p->xSFunc==0) ? 0 : FUNC_PERFECT_MATCH;
    if( p->nArg>=0 ) return 0;
  }

  /* Give a better score to a function with a specific number of arguments
  ** than to function that accepts any number of arguments. */
  if( p->nArg==nArg ){
    match = 4;
  }else{
    match = 1;
  }

  /* Bonus points if the text encoding matches */
  if( enc==(p->funcFlags & SQLITE_FUNC_ENCMASK) ){
    match += 2;  /* Exact encoding match */
  }else if( (enc & p->funcFlags & 2)!=0 ){
    match += 1;  /* Both are UTF16, but with different byte orders */
  }

  return match;
}